

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base.h
# Opt level: O0

int __thiscall
fructose::test_base<TestRingBuffer>::do_run(test_base<TestRingBuffer> *this,suite *suite)

{
  offset_in_TestRingBuffer_to_subr oVar1;
  bool bVar2;
  int iVar3;
  runtime_error *this_00;
  pointer ptVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  reference the_test_info;
  long *plVar7;
  code *local_148;
  test_root *local_f0;
  exception *ex;
  string local_b8 [8];
  string title;
  test_case test_case;
  undefined1 local_88 [8];
  pair<void_(TestRingBuffer::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
  value;
  __normal_iterator<const_fructose::test_root::test_info_*,_std::vector<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>_>
  local_38;
  const_iterator it;
  TestRingBuffer *runner;
  suite *suite_local;
  test_base<TestRingBuffer> *this_local;
  
  if (this == (test_base<TestRingBuffer> *)0x0) {
    local_f0 = (test_root *)0x0;
  }
  else {
    local_f0 = (test_root *)__dynamic_cast(this,&typeinfo,&TestRingBuffer::typeinfo,0);
  }
  if (local_f0 != (test_root *)0x0) {
    local_38._M_current =
         (test_info *)
         std::
         vector<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>::
         begin(suite);
    while( true ) {
      value.second.m_arguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>
                    ::end(suite);
      bVar2 = __gnu_cxx::operator!=
                        (&local_38,
                         (__normal_iterator<const_fructose::test_root::test_info_*,_std::vector<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>_>
                          *)&value.second.m_arguments.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar2) break;
      ptVar4 = __gnu_cxx::
               __normal_iterator<const_fructose::test_root::test_info_*,_std::vector<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>_>
               ::operator->(&local_38);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestRingBuffer::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestRingBuffer::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>_>
               ::operator[](&this->m_tests,&ptVar4->m_test_name);
      std::
      pair<void_(TestRingBuffer::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
      ::pair((pair<void_(TestRingBuffer::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
              *)local_88,pmVar5);
      oVar1 = value.first;
      local_148 = (code *)local_88;
      if (local_88 == (undefined1  [8])0x0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"No such test case: ");
        ptVar4 = __gnu_cxx::
                 __normal_iterator<const_fructose::test_root::test_info_*,_std::vector<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>_>
                 ::operator->(&local_38);
        poVar6 = std::operator<<(poVar6,(string *)ptVar4);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      else {
        __gnu_cxx::
        __normal_iterator<const_fructose::test_root::test_info_*,_std::vector<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>_>
        ::operator->(&local_38);
        std::operator+((char *)local_b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Running test case ");
        bVar2 = test_root::verbose(&this->super_test_root);
        if (bVar2) {
          poVar6 = (ostream *)
                   std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          poVar6 = std::operator<<(poVar6,local_b8);
          poVar6 = (ostream *)
                   std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          test_root::underline((test_root *)&ex,(string *)local_b8,'=');
          poVar6 = std::operator<<(poVar6,(string *)&ex);
          poVar6 = std::operator<<(poVar6,'\n');
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&ex);
        }
        (*local_f0->_vptr_test_root[2])();
        the_test_info =
             __gnu_cxx::
             __normal_iterator<const_fructose::test_root::test_info_*,_std::vector<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>_>
             ::operator*(&local_38);
        test_root::set_test_info(local_f0,the_test_info);
        plVar7 = (long *)((long)&local_f0->_vptr_test_root + oVar1);
        if (((ulong)local_148 & 1) == 0) {
        }
        else {
          local_148 = *(code **)((undefined1  [8])local_148 + *plVar7 + -1);
        }
        ptVar4 = __gnu_cxx::
                 __normal_iterator<const_fructose::test_root::test_info_*,_std::vector<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>_>
                 ::operator->(&local_38);
        (*local_148)(plVar7,ptVar4);
        (*local_f0->_vptr_test_root[3])();
        std::__cxx11::string::~string(local_b8);
      }
      std::
      pair<void_(TestRingBuffer::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
      ::~pair((pair<void_(TestRingBuffer::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
               *)local_88);
      __gnu_cxx::
      __normal_iterator<const_fructose::test_root::test_info_*,_std::vector<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>_>
      ::operator++(&local_38);
    }
    iVar3 = test_root::return_status(&this->super_test_root);
    return iVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "problem in test set-up; probable cause: test container class not passed to test_base template"
            );
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline int 
test_base<test_container>::do_run(const suite& suite) 
{
    test_container* runner = dynamic_cast<test_container*>(this);
    
    if (runner == 0)
    {
        throw std::runtime_error(
            "problem in test set-up; probable cause: "
            "test container class not passed to test_base template");
    }

    for (typename suite::const_iterator it = suite.begin(); it != suite.end(); ++it)
    {
        std::pair<test_case, test_info> value = m_tests[it->m_test_name];
        test_case test_case = value.first;
        if (test_case)
        {
            const std::string title = "Running test case " + it->m_test_name;
            if (verbose())
            {
                std::cout << std::endl << title << std::endl
                          << underline(title) << '\n' << std::endl;
            }
            runner->setup();
            runner->set_test_info(&(*it));
            try
            {
                (runner->*test_case)(it->m_test_name);    
                runner->teardown();
            }
            catch(std::exception& ex)
            {
                runner->teardown();
                set_exception_happened();
		std::cout << ex.what() << std::endl;
            }
        }
        else
        {
            std::cerr << "No such test case: " << it->m_test_name << std::endl;
        }
    }
    
    return return_status();
}